

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::genGatherFuncCall
          (string *__return_storage_ptr__,TextureGatherCase *this,GatherType gatherType,
          TextureFormat *textureFormat,GatherArgs *gatherArgs,string *refZExpr,IVec2 *offsetRange,
          int indentationDepth)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  string *psVar6;
  long *plVar7;
  undefined4 in_register_00000014;
  char cVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  ulong *puVar12;
  ostringstream s;
  long *local_4f0;
  long local_4e0;
  long lStack_4d8;
  ulong *local_4d0;
  long local_4c8;
  ulong local_4c0;
  undefined8 uStack_4b8;
  ulong *local_4b0;
  long local_4a8;
  ulong local_4a0;
  long lStack_498;
  ulong *local_490;
  long local_488;
  ulong local_480;
  long lStack_478;
  ulong *local_470;
  undefined8 local_468;
  ulong local_460;
  undefined8 uStack_458;
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0;
  long lStack_3d8;
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0;
  long lStack_3b8;
  ulong *local_3b0;
  long local_3a8;
  ulong local_3a0;
  long lStack_398;
  ulong *local_390;
  long local_388;
  ulong local_380 [2];
  long *local_370;
  undefined8 local_368;
  long local_360;
  undefined8 uStack_358;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  long *local_330;
  undefined8 local_328;
  long local_320;
  undefined8 uStack_318;
  long *local_310;
  undefined8 local_308;
  long local_300;
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  ulong *local_1c8 [2];
  ulong local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar9 = (uint)this;
  local_2b0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_2b0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (uVar9 < 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((*(int *)CONCAT44(in_register_00000014,gatherType) == 0x14) ||
     (*(int *)CONCAT44(in_register_00000014,gatherType) == 0x12)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   ", ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        gatherArgs);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1a8._0_8_);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if (2 < uVar9 - 1) goto LAB_0162a1ec;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (uVar9 == 3) {
    local_1c8[0] = local_1b8;
    cVar8 = (char)offsetRange;
    std::__cxx11::string::_M_construct((ulong)local_1c8,cVar8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1c8944c);
    local_1e8 = &local_1d8;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_1d8 = *plVar7;
      lStack_1d0 = plVar4[3];
    }
    else {
      local_1d8 = *plVar7;
      local_1e8 = (long *)*plVar4;
    }
    local_1e0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_440 = *puVar12;
      lStack_438 = plVar4[3];
      local_450 = &local_440;
    }
    else {
      local_440 = *puVar12;
      local_450 = (ulong *)*plVar4;
    }
    local_448 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_2> *)&textureFormat->type);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_450 != &local_440) {
      uVar11 = local_440;
    }
    if (uVar11 < (ulong)(local_200 + local_448)) {
      uVar11 = 0xf;
      if (local_208 != local_1f8) {
        uVar11 = local_1f8[0];
      }
      if (uVar11 < (ulong)(local_200 + local_448)) goto LAB_0162917e;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_450);
    }
    else {
LAB_0162917e:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_208);
    }
    local_370 = &local_360;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_360 = *plVar4;
      uStack_358 = puVar5[3];
    }
    else {
      local_360 = *plVar4;
      local_370 = (long *)*puVar5;
    }
    local_368 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_370);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_420 = *puVar12;
      lStack_418 = plVar4[3];
      local_430 = &local_420;
    }
    else {
      local_420 = *puVar12;
      local_430 = (ulong *)*plVar4;
    }
    local_428 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_228 = local_218;
    std::__cxx11::string::_M_construct((ulong)&local_228,cVar8);
    uVar11 = 0xf;
    if (local_430 != &local_420) {
      uVar11 = local_420;
    }
    if (uVar11 < (ulong)(local_220 + local_428)) {
      uVar11 = 0xf;
      if (local_228 != local_218) {
        uVar11 = local_218[0];
      }
      if (uVar11 < (ulong)(local_220 + local_428)) goto LAB_01629457;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_430);
    }
    else {
LAB_01629457:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_228);
    }
    local_350 = &local_340;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_340 = *plVar4;
      uStack_338 = puVar5[3];
    }
    else {
      local_340 = *plVar4;
      local_350 = (long *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_400 = *puVar12;
      lStack_3f8 = plVar4[3];
      local_410 = &local_400;
    }
    else {
      local_400 = *puVar12;
      local_410 = (ulong *)*plVar4;
    }
    local_408 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_2> *)&textureFormat[1].type);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_410 != &local_400) {
      uVar11 = local_400;
    }
    if (uVar11 < (ulong)(local_240 + local_408)) {
      uVar11 = 0xf;
      if (local_248 != local_238) {
        uVar11 = local_238[0];
      }
      if (uVar11 < (ulong)(local_240 + local_408)) goto LAB_016296ce;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_410);
    }
    else {
LAB_016296ce:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_248);
    }
    local_330 = &local_320;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_320 = *plVar4;
      uStack_318 = puVar5[3];
    }
    else {
      local_320 = *plVar4;
      local_330 = (long *)*puVar5;
    }
    local_328 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_330);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_3e0 = *puVar12;
      lStack_3d8 = plVar4[3];
      local_3f0 = &local_3e0;
    }
    else {
      local_3e0 = *puVar12;
      local_3f0 = (ulong *)*plVar4;
    }
    local_3e8 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_2a8 = local_298;
    std::__cxx11::string::_M_construct((ulong)&local_2a8,cVar8);
    uVar11 = 0xf;
    if (local_3f0 != &local_3e0) {
      uVar11 = local_3e0;
    }
    if (uVar11 < (ulong)(local_2a0 + local_3e8)) {
      uVar11 = 0xf;
      if (local_2a8 != local_298) {
        uVar11 = local_298[0];
      }
      if (uVar11 < (ulong)(local_2a0 + local_3e8)) goto LAB_0162981a;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_3f0);
    }
    else {
LAB_0162981a:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_2a8);
    }
    local_310 = &local_300;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_300 = *plVar4;
      uStack_2f8 = puVar5[3];
    }
    else {
      local_300 = *plVar4;
      local_310 = (long *)*puVar5;
    }
    local_308 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_3c0 = *puVar12;
      lStack_3b8 = plVar4[3];
      local_3d0 = &local_3c0;
    }
    else {
      local_3c0 = *puVar12;
      local_3d0 = (ulong *)*plVar4;
    }
    local_3c8 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_2> *)&textureFormat[2].type);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_3d0 != &local_3c0) {
      uVar11 = local_3c0;
    }
    if (uVar11 < (ulong)(local_260 + local_3c8)) {
      uVar11 = 0xf;
      if (local_268 != local_258) {
        uVar11 = local_258[0];
      }
      if (uVar11 < (ulong)(local_260 + local_3c8)) goto LAB_016299a1;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_3d0);
    }
    else {
LAB_016299a1:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_268);
    }
    local_2f0 = &local_2e0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_2e0 = *plVar4;
      uStack_2d8 = puVar5[3];
    }
    else {
      local_2e0 = *plVar4;
      local_2f0 = (long *)*puVar5;
    }
    local_2e8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_3a0 = *puVar12;
      lStack_398 = plVar4[3];
      local_3b0 = &local_3a0;
    }
    else {
      local_3a0 = *puVar12;
      local_3b0 = (ulong *)*plVar4;
    }
    local_3a8 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_390 = local_380;
    std::__cxx11::string::_M_construct((ulong)&local_390,cVar8);
    uVar11 = 0xf;
    if (local_3b0 != &local_3a0) {
      uVar11 = local_3a0;
    }
    if (uVar11 < (ulong)(local_388 + local_3a8)) {
      uVar11 = 0xf;
      if (local_390 != local_380) {
        uVar11 = local_380[0];
      }
      if (uVar11 < (ulong)(local_388 + local_3a8)) goto LAB_01629af5;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_3b0);
    }
    else {
LAB_01629af5:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_390);
    }
    local_2d0 = &local_2c0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_2c0 = *plVar4;
      uStack_2b8 = puVar5[3];
    }
    else {
      local_2c0 = *plVar4;
      local_2d0 = (long *)*puVar5;
    }
    local_2c8 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_4a0 = *puVar12;
      lStack_498 = plVar4[3];
      local_4b0 = &local_4a0;
    }
    else {
      local_4a0 = *puVar12;
      local_4b0 = (ulong *)*plVar4;
    }
    local_4a8 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_2> *)&textureFormat[3].type);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_4b0 != &local_4a0) {
      uVar11 = local_4a0;
    }
    if (uVar11 < (ulong)(local_280 + local_4a8)) {
      uVar11 = 0xf;
      if (local_288 != local_278) {
        uVar11 = local_278[0];
      }
      if (uVar11 < (ulong)(local_280 + local_4a8)) goto LAB_01629c67;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_4b0);
    }
    else {
LAB_01629c67:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4b0,(ulong)local_288);
    }
    local_470 = &local_460;
    puVar12 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar12) {
      local_460 = *puVar12;
      uStack_458 = puVar5[3];
    }
    else {
      local_460 = *puVar12;
      local_470 = (ulong *)*puVar5;
    }
    local_468 = puVar5[1];
    *puVar5 = puVar12;
    puVar5[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_470);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_480 = *puVar12;
      lStack_478 = plVar4[3];
      local_490 = &local_480;
    }
    else {
      local_480 = *puVar12;
      local_490 = (ulong *)*plVar4;
    }
    local_488 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pcVar1 = local_1a8 + 0x10;
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct((ulong)local_1a8,cVar8);
    uVar11 = 0xf;
    if (local_490 != &local_480) {
      uVar11 = local_480;
    }
    if (uVar11 < (ulong)(local_1a8._8_8_ + local_488)) {
      uVar11 = 0xf;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        uVar11 = local_1a8._16_8_;
      }
      if (uVar11 < (ulong)(local_1a8._8_8_ + local_488)) goto LAB_01629d9e;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)local_490);
    }
    else {
LAB_01629d9e:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_490,local_1a8._0_8_);
    }
    local_4d0 = &local_4c0;
    puVar12 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar12) {
      local_4c0 = *puVar12;
      uStack_4b8 = puVar5[3];
    }
    else {
      local_4c0 = *puVar12;
      local_4d0 = (ulong *)*puVar5;
    }
    local_4c8 = puVar5[1];
    *puVar5 = puVar12;
    puVar5[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d0);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_4e0 = *plVar7;
      lStack_4d8 = plVar4[3];
      local_4f0 = &local_4e0;
    }
    else {
      local_4e0 = *plVar7;
      local_4f0 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_4f0);
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0,local_4e0 + 1);
    }
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,local_4c0 + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_490 != &local_480) {
      operator_delete(local_490,local_480 + 1);
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0,local_4a0 + 1);
    }
    if (local_2d0 != &local_2c0) {
      operator_delete(local_2d0,local_2c0 + 1);
    }
    if (local_390 != local_380) {
      operator_delete(local_390,local_380[0] + 1);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0,local_3a0 + 1);
    }
    if (local_2f0 != &local_2e0) {
      operator_delete(local_2f0,local_2e0 + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0,local_3c0 + 1);
    }
    if (local_310 != &local_300) {
      operator_delete(local_310,local_300 + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0,local_3e0 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    if (local_410 != &local_400) {
      operator_delete(local_410,local_400 + 1);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,local_420 + 1);
    }
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if (local_450 != &local_440) {
      operator_delete(local_450,local_440 + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    puVar12 = local_1c8[0];
    if (local_1c8[0] == local_1b8) goto LAB_0162a1ec;
  }
  else if (uVar9 == 2) {
    iVar2 = *(int *)&(refZExpr->_M_dataplus)._M_p;
    iVar3 = *(int *)((long)&(refZExpr->_M_dataplus)._M_p + 4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,(iVar3 - iVar2) + 1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_470,0,(char *)0x0,0x1c89437);
    puVar12 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar12) {
      local_480 = *puVar12;
      lStack_478 = plVar4[3];
      local_490 = &local_480;
    }
    else {
      local_480 = *puVar12;
      local_490 = (ulong *)*plVar4;
    }
    local_488 = plVar4[1];
    *plVar4 = (long)puVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_490);
    puVar12 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar12) {
      local_4c0 = *puVar12;
      uStack_4b8 = puVar5[3];
      local_4d0 = &local_4c0;
    }
    else {
      local_4c0 = *puVar12;
      local_4d0 = (ulong *)*puVar5;
    }
    local_4c8 = puVar5[1];
    *puVar5 = puVar12;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    iVar2 = *(int *)&(refZExpr->_M_dataplus)._M_p;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_4d0 != &local_4c0) {
      uVar11 = local_4c0;
    }
    if (uVar11 < (ulong)(local_4a8 + local_4c8)) {
      uVar11 = 0xf;
      if (local_4b0 != &local_4a0) {
        uVar11 = local_4a0;
      }
      if (uVar11 < (ulong)(local_4a8 + local_4c8)) goto LAB_01629306;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_4b0,0,(char *)0x0,(ulong)local_4d0);
    }
    else {
LAB_01629306:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_4b0);
    }
    local_4f0 = &local_4e0;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_4e0 = *plVar4;
      lStack_4d8 = puVar5[3];
    }
    else {
      local_4e0 = *plVar4;
      local_4f0 = (long *)*puVar5;
    }
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_4f0);
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0,local_4e0 + 1);
    }
    if (local_4b0 != &local_4a0) {
      operator_delete(local_4b0,local_4a0 + 1);
    }
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,local_4c0 + 1);
    }
    if (local_490 != &local_480) {
      operator_delete(local_490,local_480 + 1);
    }
    local_1b8[0] = local_460;
    puVar12 = local_470;
    if (local_470 == &local_460) goto LAB_0162a1ec;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    tcu::operator<<((ostream *)local_1a8,(Vector<int,_2> *)&textureFormat->type);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_4d0,0,(char *)0x0,0x1c89458);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_4e0 = *plVar7;
      lStack_4d8 = plVar4[3];
      local_4f0 = &local_4e0;
    }
    else {
      local_4e0 = *plVar7;
      local_4f0 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_4f0);
    if (local_4f0 != &local_4e0) {
      operator_delete(local_4f0,local_4e0 + 1);
    }
    local_1b8[0] = local_4c0;
    puVar12 = local_4d0;
    if (local_4d0 == &local_4c0) goto LAB_0162a1ec;
  }
  operator_delete(puVar12,local_1b8[0] + 1);
LAB_0162a1ec:
  if (-1 < (int)textureFormat->order) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,textureFormat->order);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_4d0,0,(char *)0x0,0x1a93a90);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_4e0 = *plVar7;
      lStack_4d8 = plVar4[3];
      plVar10 = &local_4e0;
    }
    else {
      local_4e0 = *plVar7;
      plVar10 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar10);
    if (plVar10 != &local_4e0) {
      operator_delete(plVar10,local_4e0 + 1);
    }
    if (local_4d0 != &local_4c0) {
      operator_delete(local_4d0,local_4c0 + 1);
    }
  }
  psVar6 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar6;
}

Assistant:

string TextureGatherCase::genGatherFuncCall (GatherType gatherType, const tcu::TextureFormat& textureFormat, const GatherArgs& gatherArgs, const string& refZExpr, const IVec2& offsetRange, int indentationDepth)
{
	string result;

	switch (gatherType)
	{
		case GATHERTYPE_BASIC:
			result += "textureGather";
			break;
		case GATHERTYPE_OFFSET: // \note Fallthrough.
		case GATHERTYPE_OFFSET_DYNAMIC:
			result += "textureGatherOffset";
			break;
		case GATHERTYPE_OFFSETS:
			result += "textureGatherOffsets";
			break;
		default:
			DE_ASSERT(false);
	}

	result += "(u_sampler, v_texCoord";

	if (isDepthFormat(textureFormat))
	{
		DE_ASSERT(gatherArgs.componentNdx < 0);
		result += ", " + refZExpr;
	}

	if (gatherType == GATHERTYPE_OFFSET ||
		gatherType == GATHERTYPE_OFFSET_DYNAMIC ||
		gatherType == GATHERTYPE_OFFSETS)
	{
		result += ", ";
		switch (gatherType)
		{
			case GATHERTYPE_OFFSET:
				result += "ivec2" + de::toString(gatherArgs.offsets[0]);
				break;

			case GATHERTYPE_OFFSET_DYNAMIC:
				result += "pixCoord.yx % ivec2(" + de::toString(offsetRange.y() - offsetRange.x() + 1) + ") + " + de::toString(offsetRange.x());
				break;

			case GATHERTYPE_OFFSETS:
				result += "ivec2[4](\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[0]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[1]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[2]) + ",\n"
						  + string(indentationDepth, '\t') + "\tivec2" + de::toString(gatherArgs.offsets[3]) + ")\n"
						  + string(indentationDepth, '\t') + "\t";
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (gatherArgs.componentNdx >= 0)
	{
		DE_ASSERT(gatherArgs.componentNdx < 4);
		result += ", " + de::toString(gatherArgs.componentNdx);
	}

	result += ")";

	return result;
}